

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_compute(float64 **den,uint32 **den_idx,vector_t *obs,gauden_t *g,uint32 mgau,
                  uint32 **prev_den_idx)

{
  uint uVar1;
  uint uVar2;
  uint32 *prev_den_idx_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  uVar1 = g->n_density;
  uVar2 = g->n_top;
  uVar3 = (ulong)uVar2;
  if (uVar1 < uVar2) {
    __assert_fail("g->n_top <= g->n_density",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x479,
                  "int gauden_compute(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                 );
  }
  if (g->fullvar == (vector_t ****)0x0) {
    if (uVar2 == uVar1) {
      for (uVar4 = 0; uVar4 < g->n_feat; uVar4 = uVar4 + 1) {
        log_full_densities(den[uVar4],den_idx[uVar4],(uint32)uVar3,g->veclen[uVar4],obs[uVar4],
                           g->mean[mgau][uVar4],g->var[mgau][uVar4],g->norm[mgau][uVar4]);
        for (uVar5 = 0; uVar3 = (ulong)g->n_density, uVar5 < uVar3; uVar5 = uVar5 + 1) {
          dVar6 = exp((double)den[uVar4][uVar5]);
          den[uVar4][uVar5] = (float64)dVar6;
        }
      }
    }
    else {
      if (uVar1 <= uVar2) {
        __assert_fail("g->n_top < g->n_density",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x49e,
                      "int gauden_compute(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                     );
      }
      for (uVar4 = 0; uVar4 < g->n_feat; uVar4 = uVar4 + 1) {
        if (prev_den_idx == (uint32 **)0x0) {
          prev_den_idx_00 = (uint32 *)0x0;
        }
        else {
          prev_den_idx_00 = prev_den_idx[uVar4];
        }
        log_topn_densities(den[uVar4],den_idx[uVar4],(uint32)uVar3,g->n_density,g->veclen[uVar4],
                           obs[uVar4],g->mean[mgau][uVar4],g->var[mgau][uVar4],g->norm[mgau][uVar4],
                           prev_den_idx_00);
        for (uVar5 = 0; uVar3 = (ulong)g->n_top, uVar5 < uVar3; uVar5 = uVar5 + 1) {
          dVar6 = exp((double)den[uVar4][uVar5]);
          den[uVar4][uVar5] = (float64)dVar6;
        }
      }
    }
  }
  else {
    if (uVar2 != uVar1) {
      __assert_fail("g->n_top == g->n_density",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x47d,
                    "int gauden_compute(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                   );
    }
    for (uVar4 = 0; uVar4 < g->n_feat; uVar4 = uVar4 + 1) {
      log_full_densities_full
                (den[uVar4],den_idx[uVar4],(uint32)uVar3,g->veclen[uVar4],obs[uVar4],
                 g->mean[mgau][uVar4],g->fullvar[mgau][uVar4],g->norm[mgau][uVar4]);
      for (uVar5 = 0; uVar3 = (ulong)g->n_density, uVar5 < uVar3; uVar5 = uVar5 + 1) {
        dVar6 = exp((double)den[uVar4][uVar5]);
        den[uVar4][uVar5] = (float64)dVar6;
      }
    }
  }
  return 0;
}

Assistant:

int
gauden_compute(float64 **den,		/* density array for a mixture Gaussian */
	       uint32 **den_idx,	/* density index array for n_top < n_density eval */
	       vector_t *obs,		/* observation vector for some time */
	       gauden_t *g,		/* Gaussian density structure */
	       uint32 mgau,		/* id of the mixture Gau. to evaluate */
	       uint32 **prev_den_idx)   /* Previous frame's top N densities (or NULL) */
{
    uint32 j, k;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    /* Top-N computation not (yet) possible for full covariances */
    if (g->fullvar) {
	assert(g->n_top == g->n_density);
	for (j = 0; j < g->n_feat; j++) {
	    log_full_densities_full(den[j],
			       den_idx[j],
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->fullvar[mgau][j],
			       g->norm[mgau][j]);

	    for (k = 0; k < g->n_density; k++) {
		den[j][k] = exp( den[j][k] );
	    }
	}
    }
    else if (g->n_top == g->n_density) {
	for (j = 0; j < g->n_feat; j++) {
	    log_full_densities(den[j],
			       den_idx[j],
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->var[mgau][j],
			       g->norm[mgau][j]);

	    for (k = 0; k < g->n_density; k++) {
		den[j][k] = exp( den[j][k] );
	    }
	}
    }
    else {
	assert(g->n_top < g->n_density);

	for (j = 0; j < g->n_feat; j++) {
	    log_topn_densities(den[j],
			       den_idx[j],
			       g->n_top,
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->var[mgau][j],
			       g->norm[mgau][j],
			       prev_den_idx ? prev_den_idx[j] : NULL);

	    for (k = 0; k < g->n_top; k++) {
		den[j][k] = exp( den[j][k] );
	    }
	}
    }


#ifdef GAUDEN_VERBOSE
    gauden_print(stdout,
		 den, den_idx, g,
		 global_map, n_global_map);
#endif

    return S3_SUCCESS;
}